

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callFunctionTestSuite.cpp
# Opt level: O1

bool callOnceGetSum(void)

{
  int iVar1;
  code *pcVar2;
  iterator iVar3;
  long *plVar4;
  bool bVar5;
  Test t;
  key_type local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_48;
  
  Test::Test((Test *)&local_48);
  plVar4 = (long *)(&(((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        *)&local_48._M_impl)->_M_t)._M_impl.field_0x0 + DAT_001070e8);
  pcVar2 = accessor::
           Proxy<accessor::FunctionWrapper<Test,int,int,int>,accessor::FunctionWrapper<Test,int,int,int>>
           ::value;
  if (((ulong)accessor::
              Proxy<accessor::FunctionWrapper<Test,int,int,int>,accessor::FunctionWrapper<Test,int,int,int>>
              ::value & 1) != 0) {
    pcVar2 = *(code **)(accessor::
                        Proxy<accessor::FunctionWrapper<Test,int,int,int>,accessor::FunctionWrapper<Test,int,int,int>>
                        ::value + *plVar4 + -1);
  }
  iVar1 = (*pcVar2)(plVar4,1,1);
  if (iVar1 == 2) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"getSum","");
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&local_48,&local_68);
    if ((_Rb_tree_header *)iVar3._M_node != &local_48._M_impl.super__Rb_tree_header) {
      bVar5 = 0 < (int)iVar3._M_node[2]._M_color;
      goto LAB_0010350f;
    }
  }
  bVar5 = false;
LAB_0010350f:
  if ((iVar1 == 2) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2)) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_48);
  return bVar5;
}

Assistant:

bool callOnceGetSum()
{
  Test t;

  return (::accessor::callFunction<TestGetSum>(t, 1, 1) == 2) &&
         (t.getMethodVisitedCounter("getSum") > 0);
}